

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::anon_unknown_0::ExpandWithIndices<tinyusdz::value::point3d>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *values,
          uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *dest)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  pointer piVar4;
  pointer piVar5;
  pointer ppVar6;
  pointer ppVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  value_type_conflict vVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (dest == (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)0x0) {
    local_90.m_error._M_dataplus._M_p = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_90);
  }
  else {
    piVar4 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar4 == piVar5) {
      std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::operator=
                (dest,values);
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = true;
    }
    else {
      uVar8 = (ulong)elementSize;
      if ((elementSize != 0) &&
         ((ulong)(((long)(values->
                         super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(values->
                        super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x18) % uVar8 == 0)) {
        std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::resize
                  (dest,((long)piVar5 - (long)piVar4 >> 2) * uVar8);
        invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vVar12 = true;
        for (local_90.m_error._M_dataplus._M_p = (pointer)0x0;
            piVar4 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
            local_90.m_error._M_dataplus._M_p <
            (undefined1 *)
            ((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar4 >> 2);
            local_90.m_error._M_dataplus._M_p = local_90.m_error._M_dataplus._M_p + 1) {
          uVar3 = piVar4[(long)local_90.m_error._M_dataplus._M_p];
          if (((int)uVar3 < 0) ||
             (uVar14 = ((ulong)uVar3 + 1) * uVar8,
             uVar10 = ((long)(values->
                             super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(values->
                            super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18,
             uVar10 <= uVar14 && uVar14 - uVar10 != 0)) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (&invalidIndices,(value_type_conflict1 *)&local_90);
            vVar12 = false;
          }
          else {
            lVar11 = uVar8 * 0x18 * (long)local_90.m_error._M_dataplus._M_p;
            lVar13 = (ulong)uVar3 * uVar8 * 0x18;
            uVar10 = uVar8;
            while (bVar15 = uVar10 != 0, uVar10 = uVar10 - 1, bVar15) {
              ppVar6 = (values->
                       super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              ppVar7 = (dest->
                       super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              *(undefined8 *)((long)&ppVar7->z + lVar11) =
                   *(undefined8 *)((long)&ppVar6->z + lVar13);
              puVar1 = (undefined8 *)((long)&ppVar6->x + lVar13);
              uVar9 = puVar1[1];
              puVar2 = (undefined8 *)((long)&ppVar7->x + lVar11);
              *puVar2 = *puVar1;
              puVar2[1] = uVar9;
              lVar11 = lVar11 + 0x18;
              lVar13 = lVar13 + 0x18;
            }
          }
        }
        if (invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish ==
            invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start) {
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = true;
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value = vVar12;
        }
        else {
          tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&invalidIndices,5);
          std::operator+(&local_70,"Invalid indices found: ",&local_50);
          local_90.m_error._M_dataplus._M_p = (pointer)&local_90.m_error.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == &local_70.field_2) {
            local_90.m_error.field_2._8_8_ = local_70.field_2._8_8_;
          }
          else {
            local_90.m_error._M_dataplus._M_p = local_70._M_dataplus._M_p;
          }
          local_90.m_error._M_string_length = local_70._M_string_length;
          local_70._M_string_length = 0;
          local_70.field_2._M_local_buf[0] = '\0';
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (__return_storage_ptr__,&local_90);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  );
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}